

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_lambda.cpp
# Opt level: O3

void duckdb::ExtractParameters
               (LambdaExpression *expr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *column_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *column_aliases)

{
  BinderException *this;
  reference_wrapper<duckdb::ParsedExpression> *column_ref;
  pointer prVar1;
  vector<std::reference_wrapper<duckdb::ParsedExpression>,_true> column_refs;
  string error_message;
  vector<std::reference_wrapper<duckdb::ParsedExpression>,_true> local_60;
  string local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  LambdaExpression::ExtractColumnRefExpressions(&local_60,expr,&local_48);
  if (local_48._M_string_length == 0) {
    local_48._M_string_length = 0;
    for (prVar1 = local_60.
                  super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        prVar1 != local_60.
                  super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; prVar1 = prVar1 + 1) {
      ExtractParameter(prVar1->_M_data,column_names,column_aliases);
    }
    if (local_60.
        super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    return;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  BinderException::BinderException(this,&local_48);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ExtractParameters(LambdaExpression &expr, vector<string> &column_names, vector<string> &column_aliases) {

	// extract the lambda parameters, which are a single column
	// reference, or a list of column references (ROW function)
	string error_message;
	auto column_refs = expr.ExtractColumnRefExpressions(error_message);
	if (!error_message.empty()) {
		throw BinderException(error_message);
	}

	for (const auto &column_ref : column_refs) {
		ExtractParameter(column_ref.get(), column_names, column_aliases);
	}
	D_ASSERT(!column_names.empty());
}